

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall
llvm::Triple::Triple
          (Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr,Twine *EnvironmentStr)

{
  ArchType AVar1;
  SubArchType SVar2;
  VendorType VVar3;
  OSType OVar4;
  EnvironmentType EVar5;
  ObjectFormatType OVar6;
  StringRef local_110;
  Child local_f0 [2];
  undefined2 local_e0;
  Child local_d8 [2];
  undefined2 local_c8;
  Child local_c0 [2];
  undefined2 local_b0;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  local_b0 = 0x108;
  local_c0[0].character = '-';
  Twine::concat(&local_a8,ArchStr,(Twine *)local_c0);
  Twine::concat(&local_90,&local_a8,VendorStr);
  local_c8 = 0x108;
  local_d8[0].character = '-';
  Twine::concat(&local_78,&local_90,(Twine *)local_d8);
  Twine::concat(&local_60,&local_78,OSStr);
  local_e0 = 0x108;
  local_f0[0].character = '-';
  Twine::concat(&local_48,&local_60,(Twine *)local_f0);
  Twine::concat((Twine *)&local_110,&local_48,EnvironmentStr);
  Twine::str_abi_cxx11_(&this->Data,(Twine *)&local_110);
  Twine::str_abi_cxx11_((string *)&local_110,ArchStr);
  AVar1 = parseArch(local_110);
  std::__cxx11::string::_M_dispose();
  this->Arch = AVar1;
  Twine::str_abi_cxx11_((string *)&local_110,ArchStr);
  SVar2 = parseSubArch(local_110);
  std::__cxx11::string::_M_dispose();
  this->SubArch = SVar2;
  Twine::str_abi_cxx11_((string *)&local_110,VendorStr);
  VVar3 = parseVendor(local_110);
  std::__cxx11::string::_M_dispose();
  this->Vendor = VVar3;
  Twine::str_abi_cxx11_((string *)&local_110,OSStr);
  OVar4 = parseOS(local_110);
  std::__cxx11::string::_M_dispose();
  this->OS = OVar4;
  Twine::str_abi_cxx11_((string *)&local_110,EnvironmentStr);
  EVar5 = parseEnvironment(local_110);
  std::__cxx11::string::_M_dispose();
  this->Environment = EVar5;
  Twine::str_abi_cxx11_((string *)&local_110,EnvironmentStr);
  OVar6 = parseFormat(local_110);
  std::__cxx11::string::_M_dispose();
  this->ObjectFormat = OVar6;
  if (OVar6 == UnknownObjectFormat) {
    OVar6 = getDefaultFormat(this);
    this->ObjectFormat = OVar6;
  }
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr,
               const Twine &EnvironmentStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr + Twine('-') +
            EnvironmentStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(parseEnvironment(EnvironmentStr.str())),
      ObjectFormat(parseFormat(EnvironmentStr.str())) {
  if (ObjectFormat == Triple::UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}